

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opengl_settings.cpp
# Opt level: O0

void OpenGLSettings::gl_clear(void)

{
  PFNGLCLEARPROC p_Var1;
  GLbitfield GVar2;
  
  (*glad_glViewport)(0,0,(int)AkarinGLFW::window_dimension.field_0.x,
                     (int)AkarinGLFW::window_dimension.field_1.y);
  (*glad_glClearColor)(0.0,0.0,0.0,1.0);
  p_Var1 = glad_glClear;
  GVar2 = get_clear_mask();
  (*p_Var1)(GVar2);
  return;
}

Assistant:

void OpenGLSettings::gl_clear() noexcept
{
    glViewport(0, 0,
               static_cast<GLsizei>(AkarinGLFW::window_dimension.x),
               static_cast<GLsizei>(AkarinGLFW::window_dimension.y));
    glClearColor(0.0f, 0.0f, 0.0f, 1.0f);
    glClear(get_clear_mask());
}